

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::instruction_to_result_type
          (Compiler *this,uint32_t *result_type,uint32_t *result_id,Op op,uint32_t *args,
          uint32_t length)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  
  if ((int)op < 0x11f) {
    if ((op - OpEmitStreamVertex < 0x3e) &&
       ((0x3000010000000133U >> ((ulong)(op - OpEmitStreamVertex) & 0x3f) & 1) != 0)) {
      return false;
    }
    if ((op - OpStore < 0x26) && ((0x2000000007U >> ((ulong)(op - OpStore) & 0x3f) & 1) != 0)) {
      return false;
    }
    if (op == OpLine) {
      return false;
    }
  }
  else if ((op - OpGroupCommitReadPipe < 0x21) &&
          ((0x14000cc03U >> ((ulong)(op - OpGroupCommitReadPipe) & 0x3f) & 1) != 0)) {
    return false;
  }
  if (((length < 2) ||
      (uVar3 = (ulong)*args,
      (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar3)) ||
     (pVVar1 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
     pVVar1[uVar3].type != TypeType)) {
    bVar2 = false;
  }
  else {
    Variant::get<spirv_cross::SPIRType>(pVVar1 + uVar3);
    *result_type = *args;
    *result_id = args[1];
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Compiler::instruction_to_result_type(uint32_t &result_type, uint32_t &result_id, spv::Op op, const uint32_t *args,
                                          uint32_t length)
{
	// Most instructions follow the pattern of <result-type> <result-id> <arguments>.
	// There are some exceptions.
	switch (op)
	{
	case OpStore:
	case OpCopyMemory:
	case OpCopyMemorySized:
	case OpImageWrite:
	case OpAtomicStore:
	case OpAtomicFlagClear:
	case OpEmitStreamVertex:
	case OpEndStreamPrimitive:
	case OpControlBarrier:
	case OpMemoryBarrier:
	case OpGroupWaitEvents:
	case OpRetainEvent:
	case OpReleaseEvent:
	case OpSetUserEventStatus:
	case OpCaptureEventProfilingInfo:
	case OpCommitReadPipe:
	case OpCommitWritePipe:
	case OpGroupCommitReadPipe:
	case OpGroupCommitWritePipe:
	case OpLine:
	case OpNoLine:
		return false;

	default:
		if (length > 1 && maybe_get<SPIRType>(args[0]) != nullptr)
		{
			result_type = args[0];
			result_id = args[1];
			return true;
		}
		else
			return false;
	}
}